

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

void __thiscall ON_3dPoint::Transform(ON_3dPoint *this,ON_Xform *xform)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  dVar1 = this->x;
  dVar2 = this->y;
  dVar3 = this->z;
  dVar12 = xform->m_xform[3][2] * dVar3 +
           xform->m_xform[3][0] * dVar1 + xform->m_xform[3][1] * dVar2 + xform->m_xform[3][3];
  dVar11 = (double)(~-(ulong)(dVar12 != 0.0) & (ulong)dVar12 |
                   (ulong)(1.0 / dVar12) & -(ulong)(dVar12 != 0.0));
  dVar12 = xform->m_xform[1][1];
  dVar4 = xform->m_xform[1][0];
  dVar5 = xform->m_xform[1][2];
  dVar6 = xform->m_xform[1][3];
  dVar7 = xform->m_xform[2][1];
  dVar8 = xform->m_xform[2][0];
  dVar9 = xform->m_xform[2][2];
  dVar10 = xform->m_xform[2][3];
  this->x = (xform->m_xform[0][2] * dVar3 +
             xform->m_xform[0][0] * dVar1 + xform->m_xform[0][1] * dVar2 + xform->m_xform[0][3]) *
            dVar11;
  this->y = (dVar5 * dVar3 + dVar4 * dVar1 + dVar12 * dVar2 + dVar6) * dVar11;
  this->z = (dVar3 * dVar9 + dVar1 * dVar8 + dVar2 * dVar7 + dVar10) * dVar11;
  return;
}

Assistant:

void ON_3dPoint::Transform( const ON_Xform& xform )
{
  double xx,yy,zz,ww;
  ww = xform.m_xform[3][0]*x + xform.m_xform[3][1]*y + xform.m_xform[3][2]*z + xform.m_xform[3][3];
  if ( ww != 0.0 )
    ww = 1.0/ww;
  xx = ww*(xform.m_xform[0][0]*x + xform.m_xform[0][1]*y + xform.m_xform[0][2]*z + xform.m_xform[0][3]);
  yy = ww*(xform.m_xform[1][0]*x + xform.m_xform[1][1]*y + xform.m_xform[1][2]*z + xform.m_xform[1][3]);
  zz = ww*(xform.m_xform[2][0]*x + xform.m_xform[2][1]*y + xform.m_xform[2][2]*z + xform.m_xform[2][3]);
  x = xx;
  y = yy;
  z = zz;
}